

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2149.c
# Opt level: O0

void EPSG_setVolumeMode(EPSG *psg,int type)

{
  int type_local;
  EPSG *psg_local;
  
  if (type == 1) {
    psg->voltbl = voltbl[0];
  }
  else if (type == 2) {
    psg->voltbl = voltbl[1];
  }
  else {
    psg->voltbl = voltbl[1];
  }
  return;
}

Assistant:

void
EPSG_setVolumeMode (EPSG * psg, int type)
{
  switch (type)
  {
  case 1:
    psg->voltbl = voltbl[EMU2149_VOL_YM2149];
    break;
  case 2:
    psg->voltbl = voltbl[EMU2149_VOL_AY_3_8910];
    break;
  default:
    psg->voltbl = voltbl[EMU2149_VOL_DEFAULT];
    break;
  }
}